

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter_impl.h
# Opt level: O1

void __thiscall spdlog::details::c_formatter::format(c_formatter *this,log_msg *msg,tm *tm_time)

{
  MemoryWriter *w;
  Buffer<char> *pBVar1;
  size_t sVar2;
  long lVar3;
  
  lVar3 = (long)tm_time->tm_wday * 0x20;
  fmt::Buffer<char>::append<char>
            ((msg->formatted).super_BasicWriter<char>.buffer_,*(char **)(days_abi_cxx11_ + lVar3),
             *(char **)(days_abi_cxx11_ + lVar3) + *(long *)(days_abi_cxx11_ + lVar3 + 8));
  pBVar1 = (msg->formatted).super_BasicWriter<char>.buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  w = &msg->formatted;
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = ' ';
  lVar3 = (long)tm_time->tm_mon * 0x20;
  fmt::Buffer<char>::append<char>
            ((msg->formatted).super_BasicWriter<char>.buffer_,*(char **)(months_abi_cxx11_ + lVar3),
             *(char **)(months_abi_cxx11_ + lVar3) + *(long *)(months_abi_cxx11_ + lVar3 + 8));
  pBVar1 = (msg->formatted).super_BasicWriter<char>.buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = ' ';
  fmt::BasicWriter<char>::write_decimal<int>(&w->super_BasicWriter<char>,tm_time->tm_mday);
  pBVar1 = (msg->formatted).super_BasicWriter<char>.buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = ' ';
  pad_n_join(w,tm_time->tm_hour,tm_time->tm_min,tm_time->tm_sec,':');
  pBVar1 = (msg->formatted).super_BasicWriter<char>.buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar2 = pBVar1->size_;
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = ' ';
  fmt::BasicWriter<char>::write_decimal<int>(&w->super_BasicWriter<char>,tm_time->tm_year + 0x76c);
  return;
}

Assistant:

void format(details::log_msg &msg, const std::tm &tm_time) override
    {
        msg.formatted << days[tm_time.tm_wday] << ' ' << months[tm_time.tm_mon] << ' ' << tm_time.tm_mday << ' ';
        pad_n_join(msg.formatted, tm_time.tm_hour, tm_time.tm_min, tm_time.tm_sec, ':') << ' ' << tm_time.tm_year + 1900;
    }